

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void resolveOutOfRangeError(Parse *pParse,char *zType,int i,int mx,Expr *pError)

{
  undefined4 in_register_00000014;
  
  sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                  CONCAT44(in_register_00000014,i),zType,(ulong)(uint)mx);
  if (pError != (Expr *)0x0) {
    do {
      if (((pError->flags & 3) == 0) && (0 < (pError->w).iJoin)) {
        if ((pError->flags >> 0x1e & 1) != 0) {
          return;
        }
        pParse->db->errByteOffset = (pError->w).iJoin;
        return;
      }
      pError = pError->pLeft;
    } while (pError != (Expr *)0x0);
  }
  return;
}

Assistant:

static void resolveOutOfRangeError(
  Parse *pParse,         /* The error context into which to write the error */
  const char *zType,     /* "ORDER" or "GROUP" */
  int i,                 /* The index (1-based) of the term out of range */
  int mx,                /* Largest permissible value of i */
  Expr *pError           /* Associate the error with the expression */
){
  sqlite3ErrorMsg(pParse,
    "%r %s BY term out of range - should be "
    "between 1 and %d", i, zType, mx);
  sqlite3RecordErrorOffsetOfExpr(pParse->db, pError);
}